

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_http_to_fallback(lws *wsi,uchar *obuf,size_t olen)

{
  int iVar1;
  lws_role_ops *plVar2;
  lws_protocols *plVar3;
  lws_callback_reasons local_8c;
  char local_88 [4];
  int n;
  char ipbuf [64];
  lws_protocols *local_40;
  lws_protocols *protocol;
  lws_protocols *p1;
  lws_role_ops *role;
  size_t olen_local;
  uchar *obuf_local;
  lws *wsi_local;
  
  p1 = (lws_protocols *)&role_ops_raw_skt;
  local_40 = wsi->vhost->protocols + wsi->vhost->raw_protocol_index;
  if ((wsi->vhost->listen_accept_role != (char *)0x0) &&
     (plVar2 = lws_role_by_name(wsi->vhost->listen_accept_role), plVar2 != (lws_role_ops *)0x0)) {
    p1 = (lws_protocols *)lws_role_by_name(wsi->vhost->listen_accept_role);
  }
  if ((wsi->vhost->listen_accept_protocol != (char *)0x0) &&
     (plVar3 = lws_vhost_name_to_protocol(wsi->vhost,wsi->vhost->listen_accept_protocol),
     plVar3 != (lws_protocols *)0x0)) {
    local_40 = plVar3;
  }
  lws_bind_protocol(wsi,local_40,"lws_http_to_fallback");
  lws_role_transition(wsi,0x20000000,LRS_ESTABLISHED,(lws_role_ops *)p1);
  lws_header_table_detach(wsi,0);
  lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
  local_8c = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
  if (wsi->role_ops->adoption_cb[0] != 0) {
    local_8c = (lws_callback_reasons)wsi->role_ops->adoption_cb[0];
  }
  local_88[0] = '\0';
  lws_get_peer_simple(wsi,local_88,0x40);
  _lws_log(4,"%s: vh %s, peer: %s, role %s, protocol %s, cb %d, ah %p\n","lws_http_to_fallback",
           wsi->vhost->name,local_88,p1->name,local_40->name,local_8c,(wsi->http).ah);
  iVar1 = (*wsi->protocol->callback)(wsi,local_8c,wsi->user_space,(void *)0x0,0);
  if (iVar1 == 0) {
    local_8c = LWS_CALLBACK_RAW_RX;
    if (wsi->role_ops->rx_cb[(int)(uint)((wsi->wsistate & 0x20000000) != 0)] != 0) {
      local_8c = (lws_callback_reasons)
                 wsi->role_ops->rx_cb[(int)(uint)((wsi->wsistate & 0x20000000) != 0)];
    }
    iVar1 = (*wsi->protocol->callback)(wsi,local_8c,wsi->user_space,obuf,olen);
    if (iVar1 == 0) {
      wsi_local._4_4_ = 0;
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_http_to_fallback(struct lws *wsi, unsigned char *obuf, size_t olen)
{
	const struct lws_role_ops *role = &role_ops_raw_skt;
	const struct lws_protocols *p1, *protocol =
			 &wsi->vhost->protocols[wsi->vhost->raw_protocol_index];
	char ipbuf[64];
	int n;

	if (wsi->vhost->listen_accept_role &&
	    lws_role_by_name(wsi->vhost->listen_accept_role))
		role = lws_role_by_name(wsi->vhost->listen_accept_role);

	if (wsi->vhost->listen_accept_protocol) {
		p1 = lws_vhost_name_to_protocol(wsi->vhost,
			    wsi->vhost->listen_accept_protocol);
		if (p1)
			protocol = p1;
	}

	lws_bind_protocol(wsi, protocol, __func__);

	lws_role_transition(wsi, LWSIFR_SERVER, LRS_ESTABLISHED, role);

	lws_header_table_detach(wsi, 0);
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (wsi->role_ops->adoption_cb[0])
		n = wsi->role_ops->adoption_cb[0];

	ipbuf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
	lws_get_peer_simple(wsi, ipbuf, sizeof(ipbuf));
#endif

	lwsl_notice("%s: vh %s, peer: %s, role %s, "
		    "protocol %s, cb %d, ah %p\n", __func__, wsi->vhost->name,
		    ipbuf, role->name, protocol->name, n, wsi->http.ah);

	if ((wsi->protocol->callback)(wsi, n, wsi->user_space, NULL, 0))
		return 1;

	n = LWS_CALLBACK_RAW_RX;
	if (wsi->role_ops->rx_cb[lwsi_role_server(wsi)])
		n = wsi->role_ops->rx_cb[lwsi_role_server(wsi)];
	if (wsi->protocol->callback(wsi, n, wsi->user_space, obuf, olen))
		return 1;

	return 0;
}